

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1144a71::CodemodelConfig::DumpMinimumCMakeVersion
          (Value *__return_storage_ptr__,CodemodelConfig *this,cmStateSnapshot s)

{
  bool bVar1;
  string *value;
  Value *this_00;
  Value local_b0;
  Value local_88;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue def;
  CodemodelConfig *this_local;
  Value *minimumCMakeVersion;
  
  def.Value._7_1_ = 0;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_MINIMUM_REQUIRED_VERSION",&local_49);
  local_28 = cmStateSnapshot::GetDefinition(&s,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    Json::Value::Value(&local_88,objectValue);
    Json::Value::operator=(__return_storage_ptr__,&local_88);
    Json::Value::~Value(&local_88);
    value = cmValue::operator*[abi_cxx11_(&local_28);
    Json::Value::Value(&local_b0,value);
    this_00 = Json::Value::operator[](__return_storage_ptr__,"string");
    Json::Value::operator=(this_00,&local_b0);
    Json::Value::~Value(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CodemodelConfig::DumpMinimumCMakeVersion(cmStateSnapshot s)
{
  Json::Value minimumCMakeVersion;
  if (cmValue def = s.GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION")) {
    minimumCMakeVersion = Json::objectValue;
    minimumCMakeVersion["string"] = *def;
  }
  return minimumCMakeVersion;
}